

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O1

void test_AString_insertAString_success_bufferExpanded_fn(int _i)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *expr;
  char *pcVar4;
  char **ppcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcStack_c0;
  char *pcStack_b8;
  char *pcStack_b0;
  char *pcStack_a8;
  char *pcStack_a0;
  char *local_98;
  undefined8 uStack_90;
  AString srcString;
  AString destString;
  
  destString.reallocator._0_4_ = 0x11e238;
  destString.reallocator._4_4_ = 0;
  destString.deallocator._0_4_ = 0x11e278;
  destString.deallocator._4_4_ = 0;
  destString.buffer = (char *)0x0;
  destString.size = 5;
  destString.capacity = 8;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_90 = 0x129233;
  destString.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,9);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  builtin_strncpy(destString.buffer,"01678",6);
  srcString.buffer = (char *)0x0;
  srcString.reallocator._0_4_ = 0x11e238;
  srcString.reallocator._4_4_ = 0;
  srcString.deallocator._0_4_ = 0x11e278;
  srcString.deallocator._4_4_ = 0;
  srcString.size = 4;
  srcString.capacity = 8;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_90 = 0x129293;
  srcString.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,9);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  builtin_strncpy(srcString.buffer,"2345",5);
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_90 = 0x1292cd;
  bVar1 = AString_insertAString(&destString,2,&srcString);
  if (bVar1 == false) {
    uStack_90 = 0x129467;
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x35d,
                      "Assertion \'AString_insertAString(&destString, 2, &srcString)\' failed",0,0);
  }
  uStack_90 = 0x1292e6;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x35d);
  if (destString.capacity != 0x10) {
    pcStack_a0 = "(16)";
    pcVar6 = "(destString).capacity == (16)";
    pcVar7 = "(destString).capacity";
    iVar2 = 0x35e;
    local_98 = (char *)0x10;
    pcVar8 = (char *)destString.capacity;
    goto LAB_001296b1;
  }
  uStack_90 = 0x129306;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x35e);
  if (destString.buffer == (char *)0x0) {
    pcVar7 = "(void*) (destString).buffer != NULL";
    pcVar8 = "(void*) (destString).buffer";
    iVar2 = 0x35e;
LAB_001295d9:
    uStack_90 = 0;
    local_98 = (char *)0x0;
    pcStack_a0 = (char *)0x1295e0;
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,iVar2,"Assertion \'_ck_x != NULL\' failed",
                      "Assertion \'%s\' failed: %s == %#x",pcVar7,pcVar8);
  }
  uStack_90 = 0x129323;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x35e);
  pcVar4 = destString.buffer;
  if (destString.buffer == (char *)0x0) {
    pcVar8 = "";
    pcVar4 = "(null)";
LAB_001294f0:
    pcStack_a0 = "012345678";
    pcStack_b0 = "(\"012345678\")";
    pcVar6 = "(destString).buffer == (\"012345678\")";
    pcVar7 = "(void*) (destString).buffer";
    iVar2 = 0x35e;
  }
  else {
    uStack_90 = 0x129340;
    iVar2 = strcmp("012345678",destString.buffer);
    if (iVar2 != 0) {
      pcVar8 = "\"";
      goto LAB_001294f0;
    }
    uStack_90 = 0x129359;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x35e);
    if (destString.size != 9) {
      pcStack_a0 = "strlen(\"012345678\")";
      pcVar6 = "(destString).size == strlen(\"012345678\")";
      pcVar7 = "(destString).size";
      iVar2 = 0x35e;
      local_98 = (char *)0x9;
      pcVar8 = (char *)destString.size;
LAB_001296b1:
      expr = "Assertion \'_ck_x == _ck_y\' failed";
      pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
      ppcVar5 = &pcStack_a0;
      goto LAB_001296b3;
    }
    uStack_90 = 0x129379;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x35e);
    if (srcString.capacity != 8) {
      pcStack_a0 = "(8)";
      pcVar6 = "(srcString).capacity == (8)";
      pcVar7 = "(srcString).capacity";
      iVar2 = 0x35f;
      local_98 = (char *)0x8;
      pcVar8 = (char *)srcString.capacity;
      goto LAB_001296b1;
    }
    uStack_90 = 0x129399;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x35f);
    if (srcString.buffer == (char *)0x0) {
      pcVar7 = "(void*) (srcString).buffer != NULL";
      pcVar8 = "(void*) (srcString).buffer";
      iVar2 = 0x35f;
      goto LAB_001295d9;
    }
    uStack_90 = 0x1293b6;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x35f);
    pcVar4 = srcString.buffer;
    if (srcString.buffer == (char *)0x0) {
      pcVar4 = "(null)";
      pcVar8 = "";
    }
    else {
      uStack_90 = 0x1293d3;
      iVar2 = strcmp("2345",srcString.buffer);
      if (iVar2 == 0) {
        uStack_90 = 0x1293ec;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x35f);
        if (srcString.size == 4) {
          uStack_90 = 0x12940c;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x35f);
          if (private_ACUtilsTest_AString_reallocCount == 1) {
            uStack_90 = 0x12942e;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x360);
            uStack_90 = 0x129437;
            (*(code *)CONCAT44(destString.deallocator._4_4_,destString.deallocator._0_4_))
                      (destString.buffer);
            uStack_90 = 0x129440;
            (*(code *)CONCAT44(srcString.deallocator._4_4_,srcString.deallocator._0_4_))
                      (srcString.buffer);
            return;
          }
          pcStack_a0 = "(1)";
          pcVar6 = "private_ACUtilsTest_AString_reallocCount == (1)";
          pcVar7 = "private_ACUtilsTest_AString_reallocCount";
          iVar2 = 0x360;
          local_98 = (char *)0x1;
          pcVar8 = (char *)private_ACUtilsTest_AString_reallocCount;
        }
        else {
          pcStack_a0 = "strlen(\"2345\")";
          pcVar6 = "(srcString).size == strlen(\"2345\")";
          pcVar7 = "(srcString).size";
          iVar2 = 0x35f;
          local_98 = (char *)0x4;
          pcVar8 = (char *)srcString.size;
        }
        goto LAB_001296b1;
      }
      pcVar8 = "\"";
    }
    pcStack_a0 = "2345";
    pcStack_b0 = "(\"2345\")";
    pcVar6 = "(srcString).buffer == (\"2345\")";
    pcVar7 = "(void*) (srcString).buffer";
    iVar2 = 0x35f;
  }
  pcVar7 = pcVar7 + 8;
  expr = 
  "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
  ;
  pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
  local_98 = "\"";
  pcStack_a8 = "\"";
  ppcVar5 = &pcStack_c0;
  pcStack_c0 = pcVar4;
  pcStack_b8 = pcVar8;
LAB_001296b3:
  uStack_90 = 0;
  *(char **)((long)ppcVar5 + -8) = pcVar8;
  *(code **)((long)ppcVar5 + -0x10) = test_AString_insertAString_success_nullptrSrcArray_fn;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar2,expr,pcVar3,pcVar6,pcVar7);
}

Assistant:

END_TEST
START_TEST(test_AString_insertAString_success_bufferExpanded)
{
    struct AString destString = private_ACUtilsTest_AString_constructTestString("01678", 8);
    struct AString srcString = private_ACUtilsTest_AString_constructTestString("2345", 8);
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    ACUTILSTEST_ASSERT(AString_insertAString(&destString, 2, &srcString));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(destString, "012345678", 16);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(srcString, "2345", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(1);
    private_ACUtilsTest_AString_destructTestString(destString);
    private_ACUtilsTest_AString_destructTestString(srcString);
}